

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::removeNonbasicFreeColumn(HEkkPrimal *this)

{
  uint uVar1;
  reference pvVar2;
  long *in_RDI;
  bool removed_nonbasic_free_column;
  bool remove_nonbasic_free_column;
  
  pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                     ((vector<signed_char,_std::allocator<signed_char>_> *)(*in_RDI + 0x29a8),
                      (long)*(int *)((long)in_RDI + 0x44));
  if ((*pvVar2 == '\0') &&
     (uVar1 = HSet::remove((HSet *)(in_RDI + 0x20),(char *)(ulong)*(uint *)((long)in_RDI + 0x44)),
     (uVar1 & 1) == 0)) {
    highsLogDev((HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380),kError,
                "HEkkPrimal::phase1update failed to remove nonbasic free column %d\n",
                (ulong)*(uint *)((long)in_RDI + 0x44));
  }
  return;
}

Assistant:

void HEkkPrimal::removeNonbasicFreeColumn() {
  bool remove_nonbasic_free_column =
      ekk_instance_.basis_.nonbasicMove_[variable_in] == 0;
  if (remove_nonbasic_free_column) {
    bool removed_nonbasic_free_column =
        nonbasic_free_col_set.remove(variable_in);
    if (!removed_nonbasic_free_column) {
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kError,
                  "HEkkPrimal::phase1update failed to remove nonbasic free "
                  "column %" HIGHSINT_FORMAT "\n",
                  variable_in);
      assert(removed_nonbasic_free_column);
    }
  }
}